

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestSignalingNanSingle(void)

{
  char *unaff_retaddr;
  Single nan;
  float in_stack_ffffffffffffffec;
  undefined1 condition;
  Single *in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffffc;
  
  double_conversion::Single::NaN();
  double_conversion::Single::Single(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  double_conversion::Single::IsNan(in_stack_fffffffffffffff0);
  CheckHelper(unaff_retaddr,in_stack_fffffffffffffffc,(char *)in_stack_fffffffffffffff0,
              SUB41((uint)in_stack_ffffffffffffffec >> 0x18,0));
  double_conversion::Single::IsQuietNan(in_stack_fffffffffffffff0);
  CheckHelper(unaff_retaddr,in_stack_fffffffffffffffc,(char *)in_stack_fffffffffffffff0,
              SUB41((uint)in_stack_ffffffffffffffec >> 0x18,0));
  std::numeric_limits<float>::quiet_NaN();
  double_conversion::Single::Single(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  double_conversion::Single::IsQuietNan(in_stack_fffffffffffffff0);
  CheckHelper(unaff_retaddr,in_stack_fffffffffffffffc,(char *)in_stack_fffffffffffffff0,
              SUB41((uint)in_stack_ffffffffffffffec >> 0x18,0));
  std::numeric_limits<float>::signaling_NaN();
  double_conversion::Single::Single(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  condition = (undefined1)((uint)in_stack_ffffffffffffffec >> 0x18);
  double_conversion::Single::IsSignalingNan(in_stack_fffffffffffffff0);
  CheckHelper(unaff_retaddr,in_stack_fffffffffffffffc,(char *)in_stack_fffffffffffffff0,
              (bool)condition);
  return;
}

Assistant:

TEST(SignalingNanSingle) {
  Single nan(Single::NaN());
  CHECK(nan.IsNan());
  CHECK(nan.IsQuietNan());
  CHECK(Single(std::numeric_limits<float>::quiet_NaN()).IsQuietNan());
  CHECK(Single(std::numeric_limits<float>::signaling_NaN()).IsSignalingNan());
}